

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  ImGuiID id;
  ImGuiContext *g;
  int iVar9;
  uint uVar10;
  
  pIVar6 = GImGui;
  if ((flags & 0x10U) == 0) {
    pIVar4 = GImGui->CurrentWindow;
    id = (GImGui->LastItemData).ID;
    if (id == 0) {
      if (((GImGui->IO).MouseDown[0] != false) && (pIVar4->SkipItems == false)) {
        if (((GImGui->LastItemData).StatusFlags & 1) == 0) {
          if (GImGui->ActiveId != 0) {
            iVar8 = 0;
            if (((flags & 8U) == 0) || (GImGui->ActiveIdWindow != pIVar4)) goto LAB_00117824;
LAB_00117833:
            r_abs = &(GImGui->LastItemData).Rect;
            id = ImGuiWindow::GetIDFromRectangle(pIVar4,r_abs);
            (pIVar6->LastItemData).ID = id;
            bVar7 = ItemHoverable(r_abs,id);
            if ((bVar7) && ((pIVar6->IO).MouseClicked[0] == true)) {
              SetActiveID(id,pIVar4);
              FocusWindow(pIVar4);
            }
            iVar9 = 0;
            iVar8 = 0;
            if (pIVar6->ActiveId != id) goto LAB_00117824;
            goto LAB_00117673;
          }
        }
        else if ((flags & 8U) != 0) goto LAB_00117833;
      }
    }
    else {
      iVar8 = 0;
      if (GImGui->ActiveId != id) goto LAB_00117824;
      iVar9 = GImGui->ActiveIdMouseButton;
      if (GImGui->ActiveIdMouseButton == -1) {
        iVar9 = iVar8;
      }
      if ((GImGui->IO).MouseDown[iVar9] == false) goto LAB_00117824;
      bVar7 = false;
      iVar8 = 0;
      if (pIVar4->SkipItems != false) goto LAB_00117824;
LAB_00117673:
      pIVar6->ActiveIdAllowOverlap = bVar7;
      pIVar5 = GImGui;
      if ((GImGui->IO).MouseDown[iVar9] == true) {
        uVar10 = (pIVar4->IDStack).Data[(long)(pIVar4->IDStack).Size + -1];
        fVar2 = (GImGui->IO).MouseDragThreshold;
        fVar3 = (GImGui->IO).MouseDragMaxDistanceSqr[iVar9];
        pIVar5->NavMoveSubmitted = false;
        pIVar5->NavMoveScoringItems = false;
        pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
        pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
        pIVar5->NavAnyRequest = pIVar5->NavInitRequest;
        if (fVar2 * fVar2 <= fVar3) goto LAB_00117702;
      }
      else {
        (GImGui->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
        pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
        pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
        (pIVar5->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
        pIVar5->NavMoveSubmitted = false;
        pIVar5->NavMoveScoringItems = false;
        pIVar5->NavAnyRequest = pIVar5->NavInitRequest;
      }
    }
    iVar8 = 0;
  }
  else {
    iVar9 = 0;
    id = ImHashStr("#SourceExtern",0,0);
    uVar10 = 0;
LAB_00117702:
    if (pIVar6->DragDropActive == false) {
      ClearDragDrop();
      (pIVar6->DragDropPayload).SourceId = id;
      (pIVar6->DragDropPayload).SourceParentId = uVar10;
      pIVar6->DragDropActive = true;
      pIVar6->DragDropSourceFlags = flags;
      pIVar6->DragDropMouseButton = iVar9;
      if (id == pIVar6->ActiveId) {
        pIVar6->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar6->DragDropSourceFrameCount = pIVar6->FrameCount;
    pIVar6->DragDropWithinSource = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar6->DragDropAcceptIdPrev != 0)) &&
       ((pIVar6->DragDropAcceptFlags & 0x1000) != 0)) {
      pIVar4 = pIVar6->CurrentWindow;
      pIVar4->SkipItems = true;
      pIVar4->Hidden = true;
      pIVar4->HiddenFramesCanSkipItems = '\x01';
    }
    iVar8 = 1;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(pIVar6->LastItemData).StatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
LAB_00117824:
  return SUB41(iVar8,0);
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingNavAndKeys();
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->Hidden = tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}